

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O1

Literal * wasm::Literal::makeUnsignedMax(Literal *__return_storage_ptr__,Type type)

{
  uintptr_t uVar1;
  
  if (6 < type.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  if ((int)type.id == 3) {
    (__return_storage_ptr__->field_0).i64 = -1;
    uVar1 = 3;
  }
  else {
    if ((int)type.id != 2) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                         ,0xf5);
    }
    (__return_storage_ptr__->field_0).i32 = -1;
    uVar1 = 2;
  }
  (__return_storage_ptr__->type).id = uVar1;
  return __return_storage_ptr__;
}

Assistant:

static Literal makeUnsignedMax(Type type) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(std::numeric_limits<uint32_t>::max());
      case Type::i64:
        return Literal(std::numeric_limits<uint64_t>::max());
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }